

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O2

void __thiscall
HSimplexNla::reportArray(HSimplexNla *this,string *message,HVector *vector,bool force)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)message);
  reportArray(this,&local_40,0,vector,force);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void HSimplexNla::reportArray(const std::string message, const HVector* vector,
                              const bool force) const {
  reportArray(message, 0, vector, force);
}